

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::SizeStatistics::SizeStatistics(SizeStatistics *this,SizeStatistics *other12)

{
  long in_RSI;
  TBase *in_RDI;
  vector<long,_true> *pvVar1;
  vector<long,_true> *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__SizeStatistics_00c01070;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__SizeStatistics_00c01070;
  pvVar1 = (vector<long,_true> *)(in_RDI + 2);
  duckdb::vector<long,_true>::vector((vector<long,_true> *)0x6f2ba0);
  this_00 = (vector<long,_true> *)(in_RDI + 5);
  duckdb::vector<long,_true>::vector((vector<long,_true> *)0x6f2bb3);
  _SizeStatistics__isset::_SizeStatistics__isset((_SizeStatistics__isset *)(in_RDI + 8));
  in_RDI[1]._vptr_TBase = *(_func_int ***)(in_RSI + 8);
  duckdb::vector<long,_true>::operator=(this_00,pvVar1);
  duckdb::vector<long,_true>::operator=(this_00,pvVar1);
  *(undefined1 *)&in_RDI[8]._vptr_TBase = *(undefined1 *)(in_RSI + 0x40);
  return;
}

Assistant:

SizeStatistics::SizeStatistics(const SizeStatistics& other12) {
  unencoded_byte_array_data_bytes = other12.unencoded_byte_array_data_bytes;
  repetition_level_histogram = other12.repetition_level_histogram;
  definition_level_histogram = other12.definition_level_histogram;
  __isset = other12.__isset;
}